

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

UInt32 __thiscall testing::internal::Random::Generate(Random *this,UInt32 range)

{
  ostream *poVar1;
  GTestLog *this_00;
  GTestLog GStack_18;
  GTestLog local_14;
  
  this_00 = &GStack_18;
  this->state_ = this->state_ * 0x41c64e6d + 0x3039 & 0x7fffffff;
  if (range == 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/build_O2/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x152);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Condition range > 0 failed. ");
    std::operator<<(poVar1,"Cannot generate a number in the range [0, 0).");
    this_00 = &local_14;
  }
  else {
    if (range < 0x80000001) goto LAB_001138ec;
    GTestLog::GTestLog(&GStack_18,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/build_O2/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x154);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Condition range <= kMaxRange failed. ");
    poVar1 = std::operator<<(poVar1,"Generation of a number in [0, ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,") was requested, ");
    poVar1 = std::operator<<(poVar1,"but this can only generate numbers in [0, ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,").");
  }
  GTestLog::~GTestLog(this_00);
LAB_001138ec:
  return this->state_ % range;
}

Assistant:

UInt32 Random::Generate(UInt32 range) {
  // These constants are the same as are used in glibc's rand(3).
  // Use wider types than necessary to prevent unsigned overflow diagnostics.
  state_ = static_cast<UInt32>(1103515245ULL*state_ + 12345U) % kMaxRange;

  GTEST_CHECK_(range > 0)
      << "Cannot generate a number in the range [0, 0).";
  GTEST_CHECK_(range <= kMaxRange)
      << "Generation of a number in [0, " << range << ") was requested, "
      << "but this can only generate numbers in [0, " << kMaxRange << ").";

  // Converting via modulus introduces a bit of downward bias, but
  // it's simple, and a linear congruential generator isn't too good
  // to begin with.
  return state_ % range;
}